

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moveGeneration.cpp
# Opt level: O0

void possibleMovesBPawns(move lastMove,bitboards game,extraBitboardsInfo info,
                        arrayMoveList *possibleMoves)

{
  bool bVar1;
  int iVar2;
  byte local_75;
  byte j_2;
  ulong uStack_70;
  int i_2;
  U64 prR;
  byte j_1;
  ulong uStack_60;
  int i_1;
  U64 prL;
  byte j;
  ulong uStack_50;
  int i;
  U64 pr;
  U64 atR;
  U64 atL;
  U64 fw2;
  U64 fw1;
  arrayMoveList *possibleMoves_local;
  extraBitboardsInfo info_local;
  move lastMove_local;
  
  info_local.WhitePieces = info.BlackPieces;
  possibleMoves_local = (arrayMoveList *)info.WhitePieces;
  info_local.BlackPieces._5_2_ = lastMove._0_2_;
  info_local.BlackPieces._7_1_ = lastMove.special;
  fw2 = (game.BP & 0xffffffffffff00ff) >> 8 &
        ((info_local.WhitePieces | (ulong)possibleMoves_local) ^ 0xffffffffffffffff);
  fw1 = (U64)possibleMoves;
  constantShiftGenerator(fw2,-8,possibleMoves);
  atL = (game.BP & 0xff000000000000) >> 0x10 &
        ((info_local.WhitePieces | (ulong)possibleMoves_local) ^ 0xffffffffffffffff) &
        ((info_local.WhitePieces | (ulong)possibleMoves_local) >> 8 ^ 0xffffffffffffffff);
  constantShiftGenerator(atL,-0x10,(arrayMoveList *)fw1);
  atR = (game.BP & 0xfefefefefefe00fe) >> 9 & (ulong)possibleMoves_local;
  constantShiftGenerator(atR,-9,(arrayMoveList *)fw1);
  pr = (game.BP & 0x7f7f7f7f7f7f007f) >> 7 & (ulong)possibleMoves_local;
  constantShiftGenerator(pr,-7,(arrayMoveList *)fw1);
  uStack_50 = (game.BP & 0xff00) >> 8 &
              ((info_local.WhitePieces | (ulong)possibleMoves_local) ^ 0xffffffffffffffff);
  while (uStack_50 != 0) {
    prL._4_4_ = bitPop(&stack0xffffffffffffffb0);
    for (prL._3_1_ = 6; prL._3_1_ < 10; prL._3_1_ = prL._3_1_ + 1) {
      arrayMoveList::create((arrayMoveList *)fw1,(byte)prL._4_4_ + 0xf8,(byte)prL._4_4_,prL._3_1_);
    }
  }
  uStack_60 = (game.BP & 0x7f00) >> 7 & (info_local.WhitePieces ^ 0xffffffffffffffff) &
              (ulong)possibleMoves_local;
  while (uStack_60 != 0) {
    prR._4_4_ = bitPop(&stack0xffffffffffffffa0);
    for (prR._3_1_ = 6; prR._3_1_ < 10; prR._3_1_ = prR._3_1_ + 1) {
      arrayMoveList::create((arrayMoveList *)fw1,(byte)prR._4_4_ + 0xf9,(byte)prR._4_4_,prR._3_1_);
    }
  }
  uStack_70 = (game.BP & 0xff00) >> 9 & (info_local.WhitePieces ^ 0xffffffffffffffff) &
              (ulong)possibleMoves_local;
  while (uStack_70 != 0) {
    iVar2 = bitPop(&stack0xffffffffffffff90);
    for (local_75 = 6; local_75 < 10; local_75 = local_75 + 1) {
      arrayMoveList::create((arrayMoveList *)fw1,(byte)iVar2 + 0xf7,(byte)iVar2,local_75);
    }
  }
  if ((((info_local.BlackPieces._5_1_ != '\0') || (info_local.BlackPieces._6_1_ != 0)) &&
      (0x1f < info_local.BlackPieces._6_1_)) && (info_local.BlackPieces._6_1_ < 0x28)) {
    bVar1 = pieceAtSquare(game.WP,(uint)info_local.BlackPieces._6_1_);
    if (((bVar1) && (0x2f < info_local.BlackPieces._5_1_)) && (info_local.BlackPieces._5_1_ < 0x38))
    {
      if ((0x20 < info_local.BlackPieces._6_1_) &&
         (bVar1 = pieceAtSquare(game.BP,info_local.BlackPieces._6_1_ - 1), bVar1)) {
        arrayMoveList::create
                  ((arrayMoveList *)fw1,info_local.BlackPieces._6_1_ + 0xff,
                   info_local.BlackPieces._6_1_ + '\b','\v');
      }
      if ((info_local.BlackPieces._6_1_ < 0x27) &&
         (bVar1 = pieceAtSquare(game.BP,info_local.BlackPieces._6_1_ + 1), bVar1)) {
        arrayMoveList::create
                  ((arrayMoveList *)fw1,info_local.BlackPieces._6_1_ + '\x01',
                   info_local.BlackPieces._6_1_ + '\b','\v');
      }
    }
  }
  return;
}

Assistant:

void possibleMovesBPawns(move lastMove, const bitboards game, const extraBitboardsInfo info, arrayMoveList& possibleMoves) {
  // Move forward one
  U64 fw1 = ( (game.BP & ~Rank_2) >> 8 ) & ~(info.BlackPieces | info.WhitePieces);
  constantShiftGenerator(fw1, -8, possibleMoves);

  // Move forward two
  U64 fw2 = ((game.BP & Rank_7) >> 16) & ~(info.BlackPieces | info.WhitePieces) & ~((info.BlackPieces | info.WhitePieces) >> 8);
  constantShiftGenerator(fw2, -16, possibleMoves);

  // Attack
  U64 atL = ((game.BP & ~File_H & ~Rank_2) >> 9) & info.WhitePieces;
  constantShiftGenerator(atL, -9, possibleMoves);

  U64 atR = ((game.BP & ~File_A & ~Rank_2) >> 7) & info.WhitePieces;
  constantShiftGenerator(atR, -7, possibleMoves);

  // Promotion
  U64 pr = ((game.BP & Rank_2) >> 8) & ~(info.BlackPieces | info.WhitePieces);
  while(pr != 0) {
    int i = bitPop(pr);
    for(byte j = 6; j <= 9; j++) {
      possibleMoves.create(i - 8, i, j);
    }
  }

  U64 prL = ((game.BP & Rank_2 & ~File_A) >> 7) & ~(info.BlackPieces) & info.WhitePieces;
  while(prL != 0) {
    int i = bitPop(prL);
    for(byte j = 6; j <= 9; j++) {
      possibleMoves.create(i - 7, i, j);
    }
  }

  U64 prR = ((game.BP & Rank_2 & ~File_H) >> 9) & ~(info.BlackPieces) & info.WhitePieces;
  while(prR != 0) {
    int i = bitPop(prR);
    for(byte j = 6; j <= 9; j++) {
      possibleMoves.create(i - 9, i, j);
    }
  }

  // En passant
	if(!(lastMove.start == 0 && lastMove.end == 0)) { // Was there a last move?
		if(32 <= lastMove.end && lastMove.end <= 39) { // Did it end in our range?
			if(pieceAtSquare(game.WP, lastMove.end)  && 48 <= lastMove.start && lastMove.start <= 55) { // Was it an enemy pawn? Did this pawn move two?
				if(lastMove.end >= 33) // Was it in bounds on the left?
					if(pieceAtSquare(game.BP, lastMove.end - 1)) // Is there a friendly piece on the left side?
						possibleMoves.create(lastMove.end - 1, lastMove.end + 8, 11);
				if(lastMove.end <= 38) // Was it in bounds on the right?
					if(pieceAtSquare(game.BP, lastMove.end + 1)) // Is there a friendly piece on the right side?
						possibleMoves.create(lastMove.end + 1, lastMove.end + 8, 11);
			}
		}
	}
}